

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O0

bool clusterG2(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  int iVar1;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __last;
  size_type sVar2;
  reference pvVar3;
  reference this;
  reference pvVar4;
  TClusterId *__a;
  TClusterId *__b;
  int *piVar5;
  TClusterId *pTVar6;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RSI;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RDI;
  float fVar7;
  TClusterId *ck_1;
  int k_1;
  TClusterId *ck;
  int k;
  int cnew;
  TClusterId *cj;
  TClusterId *ci_1;
  value_type *curpair;
  int ip;
  int npairs;
  int i_2;
  TValueCC *cc;
  int j;
  int i_1;
  vector<Pair,_std::allocator<Pair>_> ccpairs;
  vector<double,_std::allocator<double>_> nsum;
  TClusterId *ci;
  int i;
  int nclusters;
  int n;
  vector<Pair,_std::allocator<Pair>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  uint uVar8;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar9;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar10;
  int local_e4;
  int local_d8;
  int local_b4;
  uint local_ac;
  int local_80;
  int local_7c;
  vector<Pair,_std::allocator<Pair>_> local_78 [2];
  undefined8 local_48;
  TClusterId *local_28;
  int local_1c;
  uint local_18;
  int local_14;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_10;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size(in_RSI);
  local_14 = (int)sVar2;
  local_18 = 0;
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_10,(long)local_1c);
    local_28 = &pvVar3->cid;
    *local_28 = local_1c + 1;
    local_18 = local_18 + 1;
  }
  local_48 = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)0x12ca1e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (value_type_conflict2 *)in_stack_fffffffffffffee0._M_current,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::allocator<double>::~allocator((allocator<double> *)0x12ca4c);
  std::vector<Pair,_std::allocator<Pair>_>::vector((vector<Pair,_std::allocator<Pair>_> *)0x12ca59);
  for (local_7c = 0; local_80 = local_7c, local_7c < local_14 + -1; local_7c = local_7c + 1) {
    while (local_80 = local_80 + 1, local_80 < local_14) {
      this = std::
             vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
             ::operator[](local_8,(long)local_7c);
      std::vector<stMatch,_std::allocator<stMatch>_>::operator[](this,(long)local_80);
      std::
      vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>
      ::
      emplace_back<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>
                ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffee0._M_current,
                 (Pair *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
  std::vector<Pair,_std::allocator<Pair>_>::begin(in_stack_fffffffffffffec8);
  std::vector<Pair,_std::allocator<Pair>_>::end(in_stack_fffffffffffffec8);
  __last._M_current._4_4_ = in_stack_fffffffffffffedc;
  __last._M_current._0_4_ = in_stack_fffffffffffffed8;
  std::
  sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>>
            (in_stack_fffffffffffffee0,__last);
  printf("[+] Top 10 pairs\n");
  for (local_ac = 0; (int)local_ac < 10; local_ac = local_ac + 1) {
    in_stack_fffffffffffffee0._M_current = (Pair *)local_78;
    uVar8 = local_ac;
    pvVar4 = std::vector<Pair,_std::allocator<Pair>_>::operator[]
                       ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffee0._M_current,
                        (long)(int)local_ac);
    uVar9 = pvVar4->i;
    pvVar4 = std::vector<Pair,_std::allocator<Pair>_>::operator[]
                       ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffee0._M_current,
                        (long)(int)local_ac);
    uVar10 = pvVar4->j;
    pvVar4 = std::vector<Pair,_std::allocator<Pair>_>::operator[]
                       ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffee0._M_current,
                        (long)(int)local_ac);
    printf("    Pair %d: %d %d %g\n",pvVar4->cc,(ulong)uVar8,(ulong)uVar9,(ulong)uVar10);
  }
  sVar2 = std::vector<Pair,_std::allocator<Pair>_>::size(local_78);
  for (local_b4 = 0; local_b4 < (int)sVar2; local_b4 = local_b4 + 1) {
    pvVar4 = std::vector<Pair,_std::allocator<Pair>_>::operator[](local_78,(long)local_b4);
    fVar7 = frand();
    if ((double)fVar7 < pvVar4->cc || (double)fVar7 == pvVar4->cc) {
      if (pvVar4->cc <= 0.5 && pvVar4->cc != 0.5) break;
      pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
               operator[](local_10,(long)pvVar4->i);
      __a = &pvVar3->cid;
      pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
               operator[](local_10,(long)pvVar4->j);
      __b = &pvVar3->cid;
      if (*__a != *__b) {
        piVar5 = std::min<int>(__a,__b);
        iVar1 = *piVar5;
        for (local_d8 = 0; local_d8 < local_14; local_d8 = local_d8 + 1) {
          pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_10,(long)local_d8);
          pTVar6 = &pvVar3->cid;
          if ((*pTVar6 == *__a) || (*pTVar6 == *__b)) {
            *pTVar6 = iVar1;
          }
        }
        local_18 = local_18 - 1;
        printf("Clusters %3d %5.4f:",pvVar4->cc,(ulong)local_18);
        for (local_e4 = 0; local_e4 < local_14; local_e4 = local_e4 + 1) {
          pvVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_10,(long)local_e4);
          printf(" %3d",(ulong)(uint)pvVar3->cid);
        }
        printf("\n");
        if (local_18 == 0x38) break;
      }
    }
  }
  std::vector<Pair,_std::allocator<Pair>_>::~vector
            ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffee0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0._M_current);
  return true;
}

Assistant:

bool clusterG2(TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<double> nsum(n + 1, 1.0);
    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto & ci = keyPresses[curpair.i].cid;
        auto & cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");

        if (nclusters == 56) break;
    }

    return true;
}